

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_parser.cpp
# Opt level: O2

void __thiscall franca::TypeParser::TypeParser(TypeParser *this)

{
  string *this_00;
  BuiltinType *val;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar1;
  adder *paVar2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>
  that_2;
  string local_148;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_128;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_120;
  Rule<std::string_()> *local_118;
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_110;
  BuiltinType local_104;
  BuiltinType local_100;
  BuiltinType local_fc;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f8;
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  *local_f0;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_e8;
  function_buffer *local_e0;
  BuiltinType *local_d8;
  function_buffer **local_d0;
  BuiltinType *local_c8;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_c0;
  char **local_78;
  BuiltinType local_70 [4];
  vtable_base local_60;
  BuiltinType *local_58;
  BuiltinType local_50 [4];
  char *local_40;
  BuiltinType *local_38;
  
  std::__cxx11::string::string((string *)&local_148,"unnamed-grammar",(allocator *)&local_128);
  local_110 = &this->type_;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_110;
  this_00 = &(this->
             super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
             ).name_;
  std::__cxx11::string::string((string *)this_00,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  local_c0.name_.field_2._M_allocated_capacity = (size_type)this_00;
  std::__cxx11::string::string((string *)&local_148,"unnamed-rule",(allocator *)&local_128);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_110,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_148,"unnamed-rule",(allocator *)&local_128);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_ref_,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  local_c0.name_._M_string_length = (size_type)&this->type_ref_;
  std::__cxx11::string::string((string *)&local_148,"unnamed-rule",(allocator *)&local_128);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->integer_interval_,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  local_e8 = &this->integer_interval_;
  std::__cxx11::string::string((string *)&local_148,"symbols",(allocator *)&local_128);
  local_f0 = &this->builtin_type_;
  boost::spirit::qi::
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  ::symbols(local_f0,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_148,"unnamed-rule",(allocator *)&local_128);
  local_118 = &this->fqn_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_118,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_148,"unnamed-rule",(allocator *)&local_128);
  local_f8 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&this->id_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_f8,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  prVar1 = local_e8;
  local_128 = local_e8;
  local_120 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_f0;
  local_148._M_string_length = (size_type)local_118;
  local_148._M_dataplus._M_p = (pointer)&local_128;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::qi::symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_110,&local_148);
  local_128 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x6187b8;
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor.members.obj_ptr = &local_fc;
  local_fc = CONCAT31(local_fc._1_3_,0x28);
  local_58 = local_70;
  local_70[0] = undefined;
  local_70[1] = 0x80000000;
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = &local_60;
  local_60.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x6187c0
  ;
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._8_8_ = (long)&local_c0.name_ + 0x18;
  local_c0.name_.field_2._8_8_ = &boost::spirit::long_long;
  local_e0 = (function_buffer *)((long)&local_c0.f + 8);
  local_d8 = &local_100;
  local_100 = CONCAT31(local_100._1_3_,0x2c);
  local_d0 = &local_e0;
  local_38 = local_50;
  local_50[0] = ~undefined;
  local_50[1] = 0x7fffffff;
  local_78 = &local_40;
  local_40 = "maxInt";
  local_c8 = (BuiltinType *)((long)&local_c0.f + 0x18);
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._16_8_ = &boost::spirit::long_long;
  local_c0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_d0;
  local_c0.name_._M_dataplus._M_p = (pointer)&local_104;
  local_104 = CONCAT31(local_104._1_3_,0x29);
  local_148._M_string_length = (size_type)&local_c0;
  local_148._M_dataplus._M_p = (pointer)&local_128;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::long_long>const&,boost::proto::exprns_::expr<boost::proto::tagns_::t___pr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (prVar1);
  local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffff00000000;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(&(this->builtin_type_).add,(char (*) [10])"undefined",
                               (BuiltinType *)&local_148);
  local_128 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)CONCAT44(local_128._4_4_,1);
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [5])0x616d84,(BuiltinType *)&local_128);
  local_c0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_4_ = 2;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [6])"UInt8",(BuiltinType *)&local_c0);
  local_d0 = (function_buffer **)CONCAT44(local_d0._4_4_,3);
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [6])0x616d8a,(BuiltinType *)&local_d0);
  local_e0 = (function_buffer *)CONCAT44(local_e0._4_4_,4);
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [7])"UInt16",(BuiltinType *)&local_e0);
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._0_4_ = 5;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [6])0x616d91,
                               (BuiltinType *)((function_buffer *)((long)&local_c0.f + 8))->data);
  local_c0.name_.field_2._8_4_ = 6;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [7])"UInt32",
                               (BuiltinType *)((long)&local_c0.name_ + 0x18));
  local_60.manager._0_4_ = 7;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [6])0x616d98,(BuiltinType *)&local_60);
  local_70[0] = 8;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [7])"UInt64",local_70);
  val = (BuiltinType *)((long)&local_c0.f + 0x18);
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._16_4_ = 9;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [8])"Boolean",val);
  local_40 = (char *)CONCAT44(local_40._4_4_,10);
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [7])"String",(BuiltinType *)&local_40);
  local_50[0] = 0xb;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [6])"Float",local_50);
  local_fc = Double;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [7])"Double",&local_fc);
  local_100 = ByteBuffer;
  paVar2 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar2,(char (*) [11])"ByteBuffer",&local_100);
  local_104 = Int32;
  boost::spirit::qi::
  symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
  ::adder::operator()(paVar2,(char (*) [8])"Integer",&local_104);
  prVar1 = local_f8;
  local_c0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_1_ = 0x2e;
  local_128 = local_f8;
  local_148._M_dataplus._M_p = "";
  local_148._M_string_length = (size_type)&local_128;
  local_120 = &local_c0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::raw>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (local_118);
  local_60.manager._0_1_ = 0x5e;
  local_70[0]._0_1_ = 0x5f;
  local_d0 = (function_buffer **)&boost::spirit::standard::alpha;
  local_c0.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )((long)&local_c0.f + 8);
  local_c0.name_._M_dataplus._M_p = (pointer)&local_d0;
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor.data[0x10] = 0x5f;
  local_e0 = (function_buffer *)&boost::spirit::standard::alnum;
  local_c0.name_.field_2._8_8_ = &local_e0;
  local_120 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)((long)&local_c0.name_ + 0x18);
  local_148._M_dataplus._M_p = "";
  local_148._M_string_length = (size_type)&local_128;
  local_128 = &local_c0;
  local_d8 = val;
  local_c8 = local_70;
  local_c0.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor.members.obj_ptr = &local_60;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (prVar1);
  return;
}

Assistant:

TypeParser::TypeParser() :
		TypeParser::base_type(type_)
{
	namespace qi = boost::spirit::qi;

	type_
		%= integer_interval_
		| builtin_type_
		| fqn_
		;

	integer_interval_
		%= qi::lit("Integer")
		>> ( '('
		   > (qi::long_long | "minInt" >> qi::attr(LLONG_MIN))
		   > ','
		   > (qi::long_long | "maxInt" >> qi::attr(LLONG_MAX))
		   > ')'
		   )
		;

	builtin_type_.add
		("undefined",  ast::BuiltinType::undefined)
		("Int8",       ast::BuiltinType::Int8)
		("UInt8",      ast::BuiltinType::UInt8)
		("Int16",      ast::BuiltinType::Int16)
		("UInt16",     ast::BuiltinType::UInt16)
		("Int32",      ast::BuiltinType::Int32)
		("UInt32",     ast::BuiltinType::UInt32)
		("Int64",      ast::BuiltinType::Int64)
		("UInt64",     ast::BuiltinType::UInt64)
		("Boolean",    ast::BuiltinType::Boolean)
		("String",     ast::BuiltinType::String)
		("Float",      ast::BuiltinType::Float)
		("Double",     ast::BuiltinType::Double)
		("ByteBuffer", ast::BuiltinType::ByteBuffer)
		("Integer",    ast::BuiltinType::Int32)
		;

	fqn_
		%= qi::raw[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | '_') >> *(qi::alnum | '_')]
		;
}